

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

void __thiscall Editor::saveAsBoard(Editor *this,path *filename,bool overwriteFile)

{
  bool bVar1;
  path *ppVar2;
  path *in_RCX;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  format_string_t<ghc::filesystem::path_&> fmt;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator local_156;
  allocator local_155;
  allocator local_154;
  allocator local_153;
  allocator_type local_152;
  allocator local_151;
  file_dialog local_150;
  string local_140;
  path saveFilename;
  undefined1 local_100 [24];
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  ghc::filesystem::path::path(&saveFilename);
  bVar1 = ghc::filesystem::path::empty(filename);
  if (bVar1) {
    bVar1 = pfd::settings::available();
    if (!bVar1) {
      spdlog::warn<char[113]>
                ((char (*) [113])
                 "Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog."
                );
      ppVar2 = Board::getFilename(this->board_);
      EditorInterface::showFileDialog(&this->interface_,false,ppVar2);
      goto LAB_00140839;
    }
    Board::getDefaultFileExtension((path *)&local_a8,this->board_);
    ghc::filesystem::path::path<char[5],ghc::filesystem::path>
              ((path *)&local_140,(char (*) [5])0x1ef60b,auto_format);
    bVar1 = ghc::filesystem::operator==((path *)&local_a8,(path *)&local_140);
    ghc::filesystem::path::~path((path *)&local_140);
    ghc::filesystem::path::~path((path *)&local_a8);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_c8,"Save As",&local_153);
      ppVar2 = Board::getFilename(this->board_);
      ghc::filesystem::path::string_abi_cxx11_((string *)(local_100 + 0x18),ppVar2);
      std::__cxx11::string::string((string *)&local_a8,"Plain Text (*.txt)",&local_154);
      std::__cxx11::string::string(local_88,"*.txt",&local_155);
      std::__cxx11::string::string(local_68,"All Files (*.*)",&local_156);
      std::__cxx11::string::string(local_48,"*",&local_151);
      __l._M_len = 4;
      __l._M_array = &local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100,__l,&local_152);
      in_RCX = (path *)local_100;
      pfd::save_file::save_file
                ((save_file *)&local_150,&local_c8,(string *)(local_100 + 0x18),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RCX,none);
      pfd::internal::file_dialog::string_result_abi_cxx11_(&local_140,&local_150);
      ghc::filesystem::path::operator=(&saveFilename,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_150.super_dialog.m_async.
                  super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      lVar3 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_a8._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x20);
      std::__cxx11::string::~string((string *)(local_100 + 0x18));
      std::__cxx11::string::~string((string *)&local_c8);
      overwriteFile = true;
    }
    else {
      Board::getDefaultFileExtension((path *)&local_a8,this->board_);
      ghc::filesystem::path::path<char[1],ghc::filesystem::path>
                ((path *)&local_140,(char (*) [1])0x1ed49c,auto_format);
      bVar1 = ghc::filesystem::operator==((path *)&local_a8,(path *)&local_140);
      ghc::filesystem::path::~path((path *)&local_140);
      ghc::filesystem::path::~path((path *)&local_a8);
      overwriteFile = true;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_c8,"Save As",&local_153);
        ppVar2 = Board::getFilename(this->board_);
        ghc::filesystem::path::string_abi_cxx11_((string *)(local_100 + 0x18),ppVar2);
        std::__cxx11::string::string((string *)&local_a8,"All Files (*.*)",&local_154);
        std::__cxx11::string::string(local_88,"*",&local_155);
        __l_00._M_len = 2;
        __l_00._M_array = &local_a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,__l_00,(allocator_type *)&local_156);
        in_RCX = (path *)local_100;
        pfd::save_file::save_file
                  ((save_file *)&local_150,&local_c8,(string *)(local_100 + 0x18),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RCX,none);
        pfd::internal::file_dialog::string_result_abi_cxx11_(&local_140,&local_150);
        ghc::filesystem::path::operator=(&saveFilename,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_150.super_dialog.m_async.
                    super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100);
        lVar3 = 0x20;
        do {
          std::__cxx11::string::~string((string *)((long)&local_a8._M_dataplus._M_p + lVar3));
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != -0x20);
        std::__cxx11::string::~string((string *)(local_100 + 0x18));
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
  }
  else {
    ghc::filesystem::path::operator=(&saveFilename,filename);
  }
  bVar1 = ghc::filesystem::path::empty(&saveFilename);
  if (bVar1) {
    spdlog::info<char[18]>((char (*) [18])"No file selected.");
  }
  else {
    if (overwriteFile == false) {
      bVar1 = ghc::filesystem::exists(&saveFilename);
      if (bVar1) {
        EditorInterface::showOverwriteDialog(&this->interface_,&saveFilename);
        goto LAB_00140839;
      }
    }
    fmt.str.size_ = (size_t)&saveFilename;
    fmt.str.data_ = (char *)0x11;
    spdlog::info<ghc::filesystem::path&>((spdlog *)"Saving to \"{}\"...",fmt,in_RCX);
    Board::saveAsFile(this->board_,&saveFilename);
    this->savedEditSize_ = this->lastEditSize_;
  }
LAB_00140839:
  ghc::filesystem::path::~path(&saveFilename);
  return;
}

Assistant:

void Editor::saveAsBoard(const fs::path& filename, bool overwriteFile) {
    fs::path saveFilename;
    if (!filename.empty()) {
        saveFilename = filename;
    } else if (pfd::settings::available()) {
        if (board_.getDefaultFileExtension() == ".txt") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "Plain Text (*.txt)", "*.txt",
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else if (board_.getDefaultFileExtension() == "") {
            saveFilename = pfd::save_file("Save As", board_.getFilename().string(), {
                "All Files (*.*)", "*"
            }, pfd::opt::none).result();
        } else {
            assert(false);
        }

        // The pfd call will prompt the user if overwriting, so skip our check for existing file.
        overwriteFile = true;
    } else {
        spdlog::warn("Portable File Dialogs is not available on this platform (or a component is missing). Using fallback file dialog.");
        return interface_.showFileDialog(false, board_.getFilename());
    }

    if (!saveFilename.empty()) {
        if (!overwriteFile && fs::exists(saveFilename)) {
            return interface_.showOverwriteDialog(saveFilename);
        }

        spdlog::info("Saving to \"{}\"...", saveFilename);
        board_.saveAsFile(saveFilename);
        savedEditSize_ = lastEditSize_;
    } else {
        spdlog::info("No file selected.");
    }
}